

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  long lVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  stbi_uc *psVar9;
  byte *pbVar10;
  stbi__uint32 sVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  stbi_uc *__dest;
  byte bVar17;
  uint uVar18;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  byte *pbVar30;
  stbi_uc *psVar31;
  bool bVar32;
  long local_100;
  uint local_f4;
  ulong local_88;
  ulong uVar19;
  
  bVar32 = depth == 0x10;
  uVar5 = x * out_n;
  uVar6 = uVar5 << bVar32;
  uVar27 = (ulong)uVar6;
  a_00 = a->s->img_n;
  lVar28 = (long)a_00;
  psVar9 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar32,0);
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar7 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar7 == 0) {
      stbi__g_failure_reason = "too large";
    }
    else {
      uVar8 = a_00 * x;
      uVar18 = uVar8 * depth + 7 >> 3;
      uVar19 = (ulong)uVar18;
      if (raw_len < (uVar18 + 1) * y) {
        stbi__g_failure_reason = "not enough pixels";
      }
      else {
        uVar18 = uVar5 - uVar18;
        if (7 < depth) {
          uVar18 = 0;
        }
        uVar21 = (ulong)uVar18;
        lVar25 = (long)(out_n << bVar32);
        lVar23 = -lVar25;
        lVar22 = uVar21 - uVar27;
        uVar18 = 0;
        uVar15 = 0;
        local_88 = (ulong)x;
        local_f4 = a_00 << bVar32;
        while( true ) {
          if (uVar15 == y) {
            if (depth < 8) {
              uVar18 = 0;
              for (uVar27 = 0; uVar27 != y; uVar27 = uVar27 + 1) {
                bVar4 = 1;
                if (color == 0) {
                  bVar4 = ""[depth];
                }
                uVar21 = (ulong)uVar18;
                psVar9 = a->out;
                uVar15 = (ulong)(uVar6 * (int)uVar27);
                if (depth == 4) {
                  lVar28 = (uVar5 - uVar19) + uVar21;
                  lVar22 = 0;
                  for (uVar24 = uVar8; 1 < (int)uVar24; uVar24 = uVar24 - 2) {
                    psVar9[lVar22 * 2 + uVar21] = (psVar9[lVar22 + lVar28] >> 4) * bVar4;
                    psVar9[lVar22 * 2 + uVar21 + 1] = (psVar9[lVar22 + lVar28] & 0xf) * bVar4;
                    lVar22 = lVar22 + 1;
                  }
                  if (uVar24 == 1) {
                    psVar9[lVar22 * 2 + uVar21] = (psVar9[lVar22 + lVar28] >> 4) * bVar4;
                  }
                }
                else {
                  pbVar30 = psVar9 + ((uVar5 + uVar15) - uVar19);
                  if (depth == 2) {
                    psVar9 = psVar9 + uVar21 + 3;
                    for (uVar24 = uVar8; 3 < (int)uVar24; uVar24 = uVar24 - 4) {
                      psVar9[-3] = (*pbVar30 >> 6) * bVar4;
                      psVar9[-2] = (*pbVar30 >> 4 & 3) * bVar4;
                      psVar9[-1] = (*pbVar30 >> 2 & 3) * bVar4;
                      *psVar9 = (*pbVar30 & 3) * bVar4;
                      pbVar30 = pbVar30 + 1;
                      psVar9 = psVar9 + 4;
                    }
                    if (((0 < (int)uVar24) && (psVar9[-3] = (*pbVar30 >> 6) * bVar4, uVar24 != 1))
                       && (psVar9[-2] = (*pbVar30 >> 4 & 3) * bVar4, uVar24 == 3)) {
                      psVar9[-1] = (*pbVar30 >> 2 & 3) * bVar4;
                    }
                  }
                  else if (depth == 1) {
                    pbVar10 = psVar9 + uVar21 + 7;
                    for (uVar24 = uVar8; 7 < (int)uVar24; uVar24 = uVar24 - 8) {
                      pbVar10[-7] = (char)*pbVar30 >> 7 & bVar4;
                      pbVar10[-6] = (char)(*pbVar30 * '\x02') >> 7 & bVar4;
                      pbVar10[-5] = (char)(*pbVar30 << 2) >> 7 & bVar4;
                      pbVar10[-4] = (char)(*pbVar30 << 3) >> 7 & bVar4;
                      pbVar10[-3] = (char)(*pbVar30 << 4) >> 7 & bVar4;
                      pbVar10[-2] = (char)(*pbVar30 << 5) >> 7 & bVar4;
                      pbVar10[-1] = (char)(*pbVar30 << 6) >> 7 & bVar4;
                      bVar17 = bVar4;
                      if ((*pbVar30 & 1) == 0) {
                        bVar17 = 0;
                      }
                      *pbVar10 = bVar17;
                      pbVar30 = pbVar30 + 1;
                      pbVar10 = pbVar10 + 8;
                    }
                    if (((((0 < (int)uVar24) &&
                          (pbVar10[-7] = (char)*pbVar30 >> 7 & bVar4, uVar24 != 1)) &&
                         ((pbVar10[-6] = (char)(*pbVar30 * '\x02') >> 7 & bVar4, 2 < uVar24 &&
                          ((pbVar10[-5] = (char)(*pbVar30 << 2) >> 7 & bVar4, uVar24 != 3 &&
                           (pbVar10[-4] = (char)(*pbVar30 << 3) >> 7 & bVar4, 4 < uVar24)))))) &&
                        (pbVar10[-3] = (char)(*pbVar30 << 4) >> 7 & bVar4, uVar24 != 5)) &&
                       (pbVar10[-2] = (char)(*pbVar30 << 5) >> 7 & bVar4, uVar24 == 7)) {
                      pbVar10[-1] = (char)(*pbVar30 << 6) >> 7 & bVar4;
                    }
                  }
                }
                if (a_00 != out_n) {
                  psVar9 = a->out;
                  iVar7 = x - 1;
                  uVar16 = x * 4;
                  uVar24 = x * 3;
                  if (a_00 == 1) {
                    uVar24 = x * 2 - 1;
                    for (iVar7 = 0; -1 < (int)((x - 1) + iVar7); iVar7 = iVar7 + -1) {
                      psVar9[uVar24 + uVar15] = 0xff;
                      psVar9[(uVar24 - 1) + uVar15] =
                           psVar9[((x - 1) + iVar7 & 0x7fffffff) + uVar15];
                      uVar24 = uVar24 - 2;
                    }
                  }
                  else {
                    while( true ) {
                      uVar24 = uVar24 - 3;
                      if (iVar7 < 0) break;
                      psVar9[(uVar16 - 1) + uVar15] = 0xff;
                      psVar9[(uVar16 - 2) + uVar15] = psVar9[(ulong)uVar24 + uVar15 + 2];
                      psVar9[(uVar16 - 3) + uVar15] = psVar9[(ulong)uVar24 + uVar15 + 1];
                      psVar9[(uVar16 - 4) + uVar15] = psVar9[uVar24 + uVar15];
                      iVar7 = iVar7 + -1;
                      uVar16 = uVar16 - 4;
                    }
                  }
                }
                uVar18 = uVar18 + uVar6;
              }
            }
            else if (depth == 0x10) {
              psVar9 = a->out;
              for (lVar28 = 0; uVar5 * y != (int)lVar28; lVar28 = lVar28 + 1) {
                puVar1 = (ushort *)(psVar9 + lVar28 * 2);
                *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              }
            }
            return 1;
          }
          uVar14 = (ulong)*raw;
          if (4 < uVar14) break;
          uVar24 = local_f4;
          if (depth < 8) {
            uVar24 = 1;
            local_88 = uVar19;
          }
          if (uVar15 == 0) {
            uVar14 = (ulong)""[uVar14];
          }
          uVar20 = (ulong)uVar18;
          psVar9 = a->out;
          uVar16 = uVar6 * (int)uVar15;
          uVar29 = 0;
          if (0 < (int)uVar24) {
            uVar29 = (ulong)uVar24;
          }
          lVar12 = -uVar27 + uVar20 + uVar21;
          for (uVar26 = 0; uVar29 != uVar26; uVar26 = uVar26 + 1) {
            switch(uVar14) {
            case 0:
            case 1:
            case 5:
            case 6:
              bVar4 = raw[uVar26 + 1];
              break;
            case 2:
              bVar4 = psVar9[uVar26 + lVar12];
              goto LAB_00106efc;
            case 3:
              bVar4 = psVar9[uVar26 + lVar12] >> 1;
LAB_00106efc:
              bVar4 = bVar4 + raw[uVar26 + 1];
              break;
            case 4:
              bVar4 = raw[uVar26 + 1];
              iVar7 = stbi__paeth(0,(uint)psVar9[uVar26 + lVar12],0);
              bVar4 = (char)iVar7 + bVar4;
              break;
            default:
              goto switchD_00106eb3_default;
            }
            psVar9[uVar26 + uVar20 + uVar21] = bVar4;
switchD_00106eb3_default:
          }
          lVar12 = (long)(int)local_f4;
          if (depth == 8) {
            lVar13 = (long)out_n;
            lVar2 = lVar28;
            if (a_00 != out_n) {
              psVar9[lVar28 + (ulong)uVar16] = 0xff;
            }
LAB_00106f64:
            raw = raw + lVar2 + 1;
            lVar2 = lVar13 + (ulong)uVar16;
          }
          else {
            if (depth == 0x10) {
              lVar13 = lVar25;
              lVar2 = lVar12;
              if (a_00 != out_n) {
                (psVar9 + lVar12 + (ulong)uVar16)[0] = 0xff;
                (psVar9 + lVar12 + (ulong)uVar16)[1] = 0xff;
              }
              goto LAB_00106f64;
            }
            raw = raw + 2;
            lVar2 = uVar21 + uVar16 + 1;
            lVar13 = 1;
          }
          __dest = psVar9 + lVar2;
          if (a_00 == out_n || depth < 8) {
            uVar16 = ((int)local_88 + -1) * uVar24;
            if ((byte)uVar14 < 7) {
              lVar12 = (long)(int)uVar24;
              switch(uVar14) {
              case 0:
                memcpy(__dest,raw,(long)(int)uVar16);
                break;
              case 1:
                uVar3 = uVar16;
                if ((int)uVar16 < 1) {
                  uVar3 = 0;
                }
                for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] = __dest[uVar14 - lVar12] + raw[uVar14];
                }
                break;
              case 2:
                uVar3 = uVar16;
                if ((int)uVar16 < 1) {
                  uVar3 = 0;
                }
                for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] = psVar9[uVar14 + lVar13 + uVar20 + lVar22] + raw[uVar14];
                }
                break;
              case 3:
                uVar3 = uVar16;
                if ((int)uVar16 < 1) {
                  uVar3 = 0;
                }
                for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] =
                       (char)((uint)__dest[uVar14 - lVar12] +
                              (uint)psVar9[uVar14 + lVar13 + uVar20 + lVar22] >> 1) + raw[uVar14];
                }
                break;
              case 4:
                uVar3 = uVar16;
                if ((int)uVar16 < 1) {
                  uVar3 = 0;
                }
                uVar14 = (ulong)uVar3;
                pbVar10 = psVar9 + lVar13 + uVar20 + lVar22;
                pbVar30 = raw;
                while (bVar32 = uVar14 != 0, uVar14 = uVar14 - 1, bVar32) {
                  bVar4 = *pbVar30;
                  iVar7 = stbi__paeth((uint)__dest[-lVar12],(uint)*pbVar10,(uint)pbVar10[-lVar12]);
                  *__dest = (char)iVar7 + bVar4;
                  __dest = __dest + 1;
                  pbVar10 = pbVar10 + 1;
                  pbVar30 = pbVar30 + 1;
                }
                break;
              case 5:
                uVar3 = uVar16;
                if ((int)uVar16 < 1) {
                  uVar3 = 0;
                }
                for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] = (__dest[uVar14 - lVar12] >> 1) + raw[uVar14];
                }
                break;
              case 6:
                uVar3 = uVar16;
                if ((int)uVar16 < 1) {
                  uVar3 = 0;
                }
                for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] = __dest[uVar14 - lVar12] + raw[uVar14];
                }
              }
            }
            raw = raw + (int)uVar16;
          }
          else {
            if ((byte)uVar14 < 7) {
              psVar31 = psVar9 + lVar13 + -uVar27 + uVar21 + uVar16;
              switch(uVar14) {
              case 0:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
                    __dest[uVar14] = raw[uVar14];
                  }
                  __dest[lVar12] = 0xff;
                  raw = raw + lVar12;
                  __dest = __dest + lVar25;
                }
                break;
              case 1:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
                    __dest[uVar14] = __dest[uVar14 + lVar23] + raw[uVar14];
                  }
                  __dest[lVar12] = 0xff;
                  raw = raw + lVar12;
                  __dest = __dest + lVar25;
                }
                break;
              case 2:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
                    __dest[uVar14] = psVar31[uVar14] + raw[uVar14];
                  }
                  __dest[lVar12] = 0xff;
                  raw = raw + lVar12;
                  __dest = __dest + lVar25;
                  psVar31 = psVar31 + lVar25;
                }
                break;
              case 3:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
                    __dest[uVar14] =
                         (char)((uint)__dest[uVar14 + lVar23] + (uint)psVar31[uVar14] >> 1) +
                         raw[uVar14];
                  }
                  __dest[lVar12] = 0xff;
                  raw = raw + lVar12;
                  __dest = __dest + lVar25;
                  psVar31 = psVar31 + lVar25;
                }
                break;
              case 4:
                local_100 = lVar23 + (long)__dest;
                psVar9 = psVar9 + lVar13 + uVar20 + ((uVar21 - lVar25) - uVar27);
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
                    bVar4 = raw[uVar14];
                    iVar7 = stbi__paeth((uint)*(byte *)(local_100 + uVar14),(uint)psVar31[uVar14],
                                        (uint)psVar9[uVar14]);
                    __dest[uVar14] = (char)iVar7 + bVar4;
                  }
                  __dest[lVar12] = 0xff;
                  raw = raw + lVar12;
                  __dest = __dest + lVar25;
                  psVar31 = psVar31 + lVar25;
                  local_100 = local_100 + lVar25;
                  psVar9 = psVar9 + lVar25;
                }
                break;
              case 5:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
                    __dest[uVar14] = (__dest[uVar14 + lVar23] >> 1) + raw[uVar14];
                  }
                  __dest[lVar12] = 0xff;
                  raw = raw + lVar12;
                  __dest = __dest + lVar25;
                }
                break;
              case 6:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
                    __dest[uVar14] = __dest[uVar14 + lVar23] + raw[uVar14];
                  }
                  __dest[lVar12] = 0xff;
                  raw = raw + lVar12;
                  __dest = __dest + lVar25;
                }
              }
            }
            if (depth == 0x10) {
              psVar9 = a->out + (long)(int)(local_f4 + 1) + uVar20;
              sVar11 = x;
              while (bVar32 = sVar11 != 0, sVar11 = sVar11 - 1, bVar32) {
                *psVar9 = 0xff;
                psVar9 = psVar9 + lVar25;
              }
            }
          }
          uVar15 = uVar15 + 1;
          uVar18 = uVar6 + uVar18;
          local_f4 = uVar24;
        }
        stbi__g_failure_reason = "invalid filter";
      }
    }
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }